

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::ComputeNF
          (ChContactTriangleXYZ *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  char *__function;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double local_70;
  double local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  peVar1 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_68 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_48 = *(undefined8 *)&peVar1->field_0x28;
    uStack_40 = *(undefined8 *)&peVar1->field_0x30;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    local_68 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_48 = *(undefined8 *)&peVar1->field_0x28;
    uStack_40 = *(undefined8 *)&peVar1->field_0x30;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_70 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_58 = *(undefined8 *)&peVar1->field_0x28;
    uStack_50 = *(undefined8 *)&peVar1->field_0x30;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    local_70 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_58 = *(undefined8 *)&peVar1->field_0x28;
    uStack_50 = *(undefined8 *)&peVar1->field_0x30;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar11 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    auVar4 = *(undefined1 (*) [16])&peVar1->field_0x28;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    dVar11 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    auVar4 = *(undefined1 (*) [16])&peVar1->field_0x28;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  auVar6._8_8_ = uStack_40;
  auVar6._0_8_ = local_48;
  auVar14 = vsubpd_avx(auVar4,auVar6);
  auVar4 = vshufpd_avx(auVar14,auVar14,1);
  auVar5._8_8_ = uStack_50;
  auVar5._0_8_ = local_58;
  auVar6 = vsubpd_avx(auVar5,auVar6);
  auVar5 = vshufpd_avx(auVar6,auVar6,1);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar6._0_8_ * auVar4._0_8_;
  auVar16 = vfmsub231sd_fma(auVar16,auVar14,auVar5);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_70 - local_68;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (dVar11 - local_68) * auVar5._0_8_;
  auVar4 = vfmsub231sd_fma(auVar15,auVar13,auVar4);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (local_70 - local_68) * auVar14._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar11 - local_68;
  auVar5 = vfmsub231sd_fma(auVar12,auVar17,auVar6);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar4._0_8_ * auVar4._0_8_;
  auVar4 = vfmadd231sd_fma(auVar14,auVar16,auVar16);
  auVar4 = vfmadd231sd_fma(auVar4,auVar5,auVar5);
  auVar4 = vsqrtsd_avx(auVar4,auVar4);
  *detJ = auVar4._0_8_;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
LAB_006296c0:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    if (2 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar7 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar8 = 3;
      dVar11 = (1.0 - U) - V;
      if (((ulong)pdVar7 & 7) == 0) {
        uVar9 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 3) {
          uVar8 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_006295ac;
        uVar8 = 0;
LAB_006295c9:
        do {
          pdVar7[uVar8] = dVar11 * pdVar3[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
      }
      else {
LAB_006295ac:
        uVar10 = 0;
        do {
          pdVar7[uVar10] = dVar11 * pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        if ((int)uVar8 != 3) goto LAB_006295c9;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_006296c0;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 6)
      goto LAB_006296d7;
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar8 = 3;
      pdVar7 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3;
      if (((ulong)pdVar7 & 7) == 0) {
        uVar9 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 3) {
          uVar8 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_0062961c;
        uVar8 = 0;
LAB_00629639:
        do {
          pdVar7[uVar8] = U * pdVar3[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
      }
      else {
LAB_0062961c:
        uVar10 = 0;
        do {
          pdVar7[uVar10] = U * pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        if ((int)uVar8 != 3) goto LAB_00629639;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_006296c0;
      if (8 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar8 = 3;
        pdVar7 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 6;
        if (((ulong)pdVar7 & 7) == 0) {
          uVar9 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar9 < 3) {
            uVar8 = (ulong)uVar9;
          }
          if (uVar9 == 0) {
            uVar8 = 0;
            goto LAB_006296a1;
          }
        }
        uVar10 = 0;
        do {
          pdVar7[uVar10] = V * pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        if ((int)uVar8 == 3) {
          return;
        }
LAB_006296a1:
        do {
          pdVar7[uVar8] = V * pdVar3[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
        return;
      }
    }
LAB_006296d7:
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChContactTriangleXYZ::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ChMatrixNM<double, 1, 3> N;
    // shape functions (U and V in 0..1 as triangle integration)
    N(0) = 1 - U - V;
    N(1) = U;
    N(2) = V;

    // determinant of jacobian is also =2*areaoftriangle, also length of cross product of sides
    ChVector<> p0 = GetNode1()->GetPos();
    ChVector<> p1 = GetNode2()->GetPos();
    ChVector<> p2 = GetNode3()->GetPos();
    detJ = (Vcross(p2 - p0, p1 - p0)).Length();

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);
    Qi.segment(3, 3) = N(1) * F.segment(0, 3);
    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}